

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

void scp_source_process_stack(ScpSource *scp)

{
  SftpReplyBuilder *pSVar1;
  ScpSourceNodeType SVar2;
  uint64_t size;
  void *__src;
  size_t __n;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  ScpSourceStackEntry *wildcard;
  ScpSourceStackEntry *pSVar6;
  ulong uVar7;
  char *pcVar8;
  void *pvVar9;
  strbuf *buf_o;
  ulong uVar10;
  ScpSourceStackEntry *wc;
  size_t sVar11;
  ScpSourceStackEntry *ptr;
  ScpSourceStackEntry *pSVar12;
  size_t sVar13;
  ptrlen pathname;
  ptrlen pathname_00;
  ptrlen pVar14;
  
  if (scp->throttled != false) {
    return;
  }
  if (0 < scp->n_pending_commands) {
    do {
      if (scp->eof == true) {
        scp_source_abort(scp,"scp: received client EOF, abandoning transfer");
        return;
      }
      if (scp->acks == 0) {
        return;
      }
      scp->acks = scp->acks + -1;
      buf_o = scp->pending_commands[0];
      if (buf_o->len != 0) {
        (*scp->sc->vt->write)(scp->sc,false,buf_o->s,buf_o->len);
        buf_o = scp->pending_commands[0];
      }
      strbuf_free(buf_o);
      iVar5 = scp->n_pending_commands;
      uVar4 = iVar5 - 1;
      scp->n_pending_commands = uVar4;
    } while ((1 < iVar5) &&
            (memmove(scp->pending_commands,scp->pending_commands + 1,(ulong)uVar4 << 3),
            0 < scp->n_pending_commands));
  }
  ptr = scp->head;
  if (ptr == (ScpSourceStackEntry *)0x0) {
    (*scp->sc->vt->send_exit_status)(scp->sc,0);
    (*scp->sc->vt->write_eof)(scp->sc);
    (*scp->sc->vt->initiate_close)(scp->sc,(char *)0x0);
    scp->finished = true;
    return;
  }
  SVar2 = ptr->type;
  if (SVar2 == SCP_READFILE) {
    uVar7 = scp->file_size - scp->file_offset;
    if (uVar7 != 0) {
      uVar10 = 0x1000;
      if (uVar7 < 0x1000) {
        uVar10 = uVar7;
      }
      (*scp->sf->vt->read)(scp->sf,&(scp->reply).srb,ptr->handle,scp->file_offset,(uint)uVar10);
      if ((scp->reply).err == true) {
        uVar4 = string_length_for_printf((scp->head->pathname).len);
        scp_source_abort(scp,"%.*s: unable to read: %s",(ulong)uVar4,(scp->head->pathname).ptr,
                         (scp->reply).errmsg);
        return;
      }
      sVar13 = (*scp->sc->vt->write)(scp->sc,false,(scp->reply).data.ptr,(scp->reply).data.len);
      scp->file_offset = scp->file_offset + (scp->reply).data.len;
      if (0xffff < (int)sVar13) {
        return;
      }
      goto LAB_001111d6;
    }
    (*scp->sc->vt->write)(scp->sc,false,"",1);
    (*scp->sf->vt->close)(scp->sf,&(scp->reply).srb,scp->head->handle);
    ptr = scp->head;
    scp->head = ptr->next;
  }
  else if (SVar2 == SCP_ROOTPATH) {
    scp->head = ptr->next;
    wildcard = (ScpSourceStackEntry *)mkstr(ptr->pathname);
    sVar11 = 1;
    pSVar6 = (ScpSourceStackEntry *)safemalloc((ptr->pathname).len + 1,1,0);
    _Var3 = wc_unescape((char *)pSVar6,(char *)wildcard);
    if (_Var3) {
      sVar11 = strlen((char *)wildcard);
      wc = (ScpSourceStackEntry *)0x0;
      pSVar12 = wildcard;
    }
    else {
      pcVar8 = strrchr((char *)wildcard,0x2f);
      if (pcVar8 == (char *)0x0) {
        pSVar12 = (ScpSourceStackEntry *)0x16559c;
        wc = wildcard;
      }
      else {
        *pcVar8 = '\0';
        _Var3 = wc_unescape((char *)pSVar6,(char *)wildcard);
        if (!_Var3) {
          scp_source_abort(scp,
                           "scp: wildcards in path components before the file name not supported");
          safefree(wildcard);
          goto LAB_00110eeb;
        }
        sVar11 = strlen((char *)pSVar6);
        wc = (ScpSourceStackEntry *)(pcVar8 + 1);
        pSVar12 = pSVar6;
      }
    }
    pVar14.len = sVar11;
    pVar14.ptr = pSVar12;
    (*scp->sf->vt->stat)(scp->sf,&(scp->reply).srb,pVar14,true);
    if ((scp->reply).err == true) {
      uVar4 = string_length_for_printf(sVar11);
      scp_source_abort(scp,"%.*s: unable to access: %s",(ulong)uVar4,pSVar12,(scp->reply).errmsg);
      safefree(wildcard);
      safefree(pSVar6);
      pSVar6 = ptr;
LAB_00110eeb:
      safefree(pSVar6);
      return;
    }
    pathname.len = sVar11;
    pathname.ptr = pSVar12;
    scp_source_push_name(scp,pathname,(scp->reply).attrs,(char *)wc);
    safefree(wildcard);
    safefree(pSVar6);
  }
  else {
    scp->head = ptr->next;
    if (SVar2 == SCP_READDIR) {
      pSVar1 = &(scp->reply).srb;
      (*scp->sf->vt->readdir)(scp->sf,pSVar1,ptr->handle,1,true);
      if ((scp->reply).err == true) {
        if ((scp->reply).code != 1) {
          uVar4 = string_length_for_printf((ptr->pathname).len);
          scp_source_err(scp,"%.*s: unable to list directory: %s",(ulong)uVar4,(ptr->pathname).ptr,
                         (scp->reply).errmsg);
        }
        (*scp->sf->vt->close)(scp->sf,pSVar1,ptr->handle);
LAB_00110fb0:
        if (ptr->wildcard == (char *)0x0) {
          scp_source_send_E(scp);
        }
      }
      else {
        _Var3 = ptrlen_eq_string((scp->reply).name,".");
        if (((_Var3) || (_Var3 = ptrlen_eq_string((scp->reply).name,".."), _Var3)) ||
           ((ptr->wildcard != (char *)0x0 &&
            (iVar5 = wc_match_pl(ptr->wildcard,(scp->reply).name), iVar5 == 0)))) {
          scp->head = ptr;
        }
        else {
          sVar13 = (ptr->pathname).len + (scp->reply).name.len + 1;
          pvVar9 = safemalloc(sVar13,1,0);
          memcpy(pvVar9,(ptr->pathname).ptr,(ptr->pathname).len);
          *(undefined1 *)((long)pvVar9 + (ptr->pathname).len) = 0x2f;
          memcpy((void *)((long)pvVar9 + (ptr->pathname).len + 1),(scp->reply).name.ptr,
                 (scp->reply).name.len);
          scp->head = ptr;
          pathname_00.len = sVar13;
          pathname_00.ptr = pvVar9;
          scp_source_push_name(scp,pathname_00,(scp->reply).attrs,(char *)0x0);
          safefree(pvVar9);
        }
        ptr = (ScpSourceStackEntry *)0x0;
      }
    }
    else if (((ptr->attrs).permissions & 0x4000) == 0) {
      pSVar1 = &(scp->reply).srb;
      (*scp->sf->vt->open)(scp->sf,pSVar1,ptr->pathname,1,(fxp_attrs)ZEXT1656(ZEXT816(0)));
      if ((scp->reply).err == true) {
        uVar4 = string_length_for_printf((ptr->pathname).len);
        scp_source_err(scp,"%.*s: unable to open: %s",(ulong)uVar4,(ptr->pathname).ptr,
                       (scp->reply).errmsg);
        goto LAB_001111d6;
      }
      (*scp->sf->vt->fstat)(scp->sf,pSVar1,(scp->reply).handle);
      if ((scp->reply).err == true) {
        uVar4 = string_length_for_printf((ptr->pathname).len);
        scp_source_err(scp,"%.*s: unable to stat: %s",(ulong)uVar4,(ptr->pathname).ptr,
                       (scp->reply).errmsg);
        (*scp->sf->vt->close)(scp->sf,pSVar1,(scp->reply).handle);
        goto LAB_001111d6;
      }
      scp->file_offset = 0;
      size = (scp->reply).attrs.size;
      scp->file_size = size;
      scp_source_send_CD(scp,'C',ptr->attrs,size,ptr->pathname);
      pvVar9 = (ptr->pathname).ptr;
      sVar11 = (ptr->pathname).len;
      __src = (scp->reply).handle.ptr;
      __n = (scp->reply).handle.len;
      pSVar6 = (ScpSourceStackEntry *)safemalloc(1,0x70,__n + sVar11);
      memcpy(pSVar6 + 1,pvVar9,sVar11);
      (pSVar6->pathname).ptr = pSVar6 + 1;
      (pSVar6->pathname).len = sVar11;
      pvVar9 = (void *)((long)&pSVar6[1].next + sVar11);
      memcpy(pvVar9,__src,__n);
      (pSVar6->handle).ptr = pvVar9;
      (pSVar6->handle).len = __n;
      pSVar6->wildcard = (char *)0x0;
      (pSVar6->attrs).flags = 0;
      (pSVar6->attrs).size = 0;
      (pSVar6->attrs).uid = 0;
      (pSVar6->attrs).gid = 0;
      (pSVar6->attrs).permissions = 0;
      (pSVar6->attrs).atime = 0;
      (pSVar6->attrs).mtime = 0;
      pSVar6->type = SCP_READFILE;
      pSVar6->next = scp->head;
      scp->head = pSVar6;
    }
    else {
      if (scp->recursive == false) {
        if (ptr->wildcard == (char *)0x0) {
          __assert_fail("scp->recursive || node->wildcard",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/scpserver.c"
                        ,0x332,"void scp_source_process_stack(ScpSource *)");
        }
      }
      else if (ptr->wildcard == (char *)0x0) {
        scp_source_send_CD(scp,'D',ptr->attrs,0,ptr->pathname);
      }
      (*scp->sf->vt->opendir)(scp->sf,&(scp->reply).srb,ptr->pathname);
      if ((scp->reply).err == true) {
        uVar4 = string_length_for_printf((ptr->pathname).len);
        scp_source_err(scp,"%.*s: unable to access: %s",(ulong)uVar4,(ptr->pathname).ptr,
                       (scp->reply).errmsg);
        goto LAB_00110fb0;
      }
      scp_source_push(scp,SCP_READDIR,ptr->pathname,(scp->reply).handle,(fxp_attrs *)0x0,
                      ptr->wildcard);
    }
  }
  safefree(ptr);
LAB_001111d6:
  queue_toplevel_callback(scp_source_process_stack_cb,scp);
  return;
}

Assistant:

static void scp_source_process_stack(ScpSource *scp)
{
    if (scp->throttled)
        return;

    while (scp->n_pending_commands > 0) {
        /* Expect an ack, and consume it */
        if (scp->eof) {
            scp_source_abort(
                scp, "scp: received client EOF, abandoning transfer");
            return;
        }
        if (scp->acks == 0)
            return;
        scp->acks--;

        /*
         * Now send the actual command (unless it was the phony
         * zero-length one that indicates our need for an ack before
         * beginning to send file data).
         */

        if (scp->pending_commands[0]->len)
            sshfwd_write(scp->sc, scp->pending_commands[0]->s,
                         scp->pending_commands[0]->len);

        strbuf_free(scp->pending_commands[0]);
        scp->n_pending_commands--;
        if (scp->n_pending_commands > 0) {
            /*
             * We still have at least one pending command to send, so
             * move up the queue.
             *
             * (We do that with a bodgy memmove, because there are at
             * most a bounded number of commands ever pending at once,
             * so no need to worry about quadratic time.)
             */
            memmove(scp->pending_commands, scp->pending_commands+1,
                    scp->n_pending_commands * sizeof(*scp->pending_commands));
        }
    }

    /*
     * Mostly, we start by waiting for an ack byte from the receiver.
     */
    if (scp->head && scp->head->type == SCP_READFILE && scp->file_offset) {
        /*
         * Exception: if we're already in the middle of transferring a
         * file, we'll be called back here because the channel backlog
         * has cleared; we don't need to wait for an ack.
         */
    } else if (scp->head && scp->head->type == SCP_ROOTPATH) {
        /*
         * Another exception: the initial action node that makes us
         * stat the root path. We'll translate it into an SCP_NAME,
         * and _that_ will require an ack.
         */
        ScpSourceStackEntry *node = scp->head;
        scp->head = node->next;

        /*
         * Start by checking if there's a wildcard involved in the
         * root path.
         */
        char *rootpath_str = mkstr(node->pathname);
        char *rootpath_unesc = snewn(1+node->pathname.len, char);
        ptrlen pathname;
        const char *wildcard;

        if (wc_unescape(rootpath_unesc, rootpath_str)) {
            /*
             * We successfully removed instances of the escape
             * character used in our wildcard syntax, without
             * encountering any actual wildcard chars - i.e. this is
             * not a wildcard, just a single file. The simple case.
             */
            pathname = ptrlen_from_asciz(rootpath_str);
            wildcard = NULL;
        } else {
            /*
             * This is a wildcard. Separate it into a directory name
             * (which we enforce mustn't contain wc characters, for
             * simplicity) and a wildcard to match leaf names.
             */
            char *last_slash = strrchr(rootpath_str, '/');

            if (last_slash) {
                wildcard = last_slash + 1;
                *last_slash = '\0';
                if (!wc_unescape(rootpath_unesc, rootpath_str)) {
                    scp_source_abort(scp, "scp: wildcards in path components "
                                     "before the file name not supported");
                    sfree(rootpath_str);
                    sfree(rootpath_unesc);
                    return;
                }

                pathname = ptrlen_from_asciz(rootpath_unesc);
            } else {
                pathname = PTRLEN_LITERAL(".");
                wildcard = rootpath_str;
            }
        }

        /*
         * Now we know what directory we're scanning, and what
         * wildcard (if any) we're using to match the filenames we get
         * back.
         */
        sftpsrv_stat(scp->sf, &scp->reply.srb, pathname, true);
        if (scp->reply.err) {
            scp_source_abort(
                scp, "%.*s: unable to access: %s",
                PTRLEN_PRINTF(pathname), scp->reply.errmsg);
            sfree(rootpath_str);
            sfree(rootpath_unesc);
            sfree(node);
            return;
        }

        scp_source_push_name(scp, pathname, scp->reply.attrs, wildcard);

        sfree(rootpath_str);
        sfree(rootpath_unesc);
        sfree(node);
        scp_requeue(scp);
        return;
    } else {
    }

    if (scp->head && scp->head->type == SCP_READFILE) {
        /*
         * Transfer file data if our backlog hasn't filled up.
         */
        int backlog;
        uint64_t limit = scp->file_size - scp->file_offset;
        if (limit > 4096)
            limit = 4096;
        if (limit > 0) {
            sftpsrv_read(scp->sf, &scp->reply.srb, scp->head->handle,
                         scp->file_offset, limit);
            if (scp->reply.err) {
                scp_source_abort(
                    scp, "%.*s: unable to read: %s",
                    PTRLEN_PRINTF(scp->head->pathname), scp->reply.errmsg);
                return;
            }

            backlog = sshfwd_write(
                scp->sc, scp->reply.data.ptr, scp->reply.data.len);
            scp->file_offset += scp->reply.data.len;

            if (backlog < SCP_MAX_BACKLOG)
                scp_requeue(scp);
            return;
        }

        /*
         * If we're done, send a terminating zero byte, close our file
         * handle, and pop the stack.
         */
        sshfwd_write(scp->sc, "\0", 1);
        sftpsrv_close(scp->sf, &scp->reply.srb, scp->head->handle);
        ScpSourceStackEntry *node = scp->head;
        scp->head = node->next;
        sfree(node);
        scp_requeue(scp);
        return;
    }

    /*
     * If our queue is actually empty, send outgoing EOF.
     */
    if (!scp->head) {
        sshfwd_send_exit_status(scp->sc, 0);
        sshfwd_write_eof(scp->sc);
        sshfwd_initiate_close(scp->sc, NULL);
        scp->finished = true;
        return;
    }

    /*
     * Otherwise, handle a command.
     */
    ScpSourceStackEntry *node = scp->head;
    scp->head = node->next;

    if (node->type == SCP_READDIR) {
        sftpsrv_readdir(scp->sf, &scp->reply.srb, node->handle, 1, true);
        if (scp->reply.err) {
            if (scp->reply.code != SSH_FX_EOF)
                scp_source_err(scp, "%.*s: unable to list directory: %s",
                               PTRLEN_PRINTF(node->pathname),
                               scp->reply.errmsg);
            sftpsrv_close(scp->sf, &scp->reply.srb, node->handle);

            if (!node->wildcard) {
                /*
                 * Send 'pop stack' or 'end of directory' command,
                 * unless this was the topmost READDIR in a
                 * wildcard-based retrieval (in which case we didn't
                 * send a D command to start, so an E now would have
                 * no stack entry to pop).
                 */
                scp_source_send_E(scp);
            }
        } else if (ptrlen_eq_string(scp->reply.name, ".") ||
                   ptrlen_eq_string(scp->reply.name, "..") ||
                   (node->wildcard &&
                    !wc_match_pl(node->wildcard, scp->reply.name))) {
            /* Skip special directory names . and .., and anything
             * that doesn't match our wildcard (if we have one). */
            scp->head = node;     /* put back the unfinished READDIR */
            node = NULL;          /* and prevent it being freed */
        } else {
            ptrlen subpath;
            subpath.len = node->pathname.len + 1 + scp->reply.name.len;
            char *subpath_space = snewn(subpath.len, char);
            subpath.ptr = subpath_space;
            memcpy(subpath_space, node->pathname.ptr, node->pathname.len);
            subpath_space[node->pathname.len] = '/';
            memcpy(subpath_space + node->pathname.len + 1,
                   scp->reply.name.ptr, scp->reply.name.len);

            scp->head = node;     /* put back the unfinished READDIR */
            node = NULL;          /* and prevent it being freed */
            scp_source_push_name(scp, subpath, scp->reply.attrs, NULL);

            sfree(subpath_space);
        }
    } else if (node->attrs.permissions & PERMS_DIRECTORY) {
        assert(scp->recursive || node->wildcard);

        if (!node->wildcard)
            scp_source_send_CD(scp, 'D', node->attrs, 0, node->pathname);
        sftpsrv_opendir(scp->sf, &scp->reply.srb, node->pathname);
        if (scp->reply.err) {
            scp_source_err(
                scp, "%.*s: unable to access: %s",
                PTRLEN_PRINTF(node->pathname), scp->reply.errmsg);

            if (!node->wildcard) {
                /* Send 'pop stack' or 'end of directory' command. */
                scp_source_send_E(scp);
            }
        } else {
            scp_source_push(
                scp, SCP_READDIR, node->pathname,
                scp->reply.handle, NULL, node->wildcard);
        }
    } else {
        sftpsrv_open(scp->sf, &scp->reply.srb,
                     node->pathname, SSH_FXF_READ, no_attrs);
        if (scp->reply.err) {
            scp_source_err(
                scp, "%.*s: unable to open: %s",
                PTRLEN_PRINTF(node->pathname), scp->reply.errmsg);
            scp_requeue(scp);
            return;
        }
        sftpsrv_fstat(scp->sf, &scp->reply.srb, scp->reply.handle);
        if (scp->reply.err) {
            scp_source_err(
                scp, "%.*s: unable to stat: %s",
                PTRLEN_PRINTF(node->pathname), scp->reply.errmsg);
            sftpsrv_close(scp->sf, &scp->reply.srb, scp->reply.handle);
            scp_requeue(scp);
            return;
        }
        scp->file_offset = 0;
        scp->file_size = scp->reply.attrs.size;
        scp_source_send_CD(scp, 'C', node->attrs,
                           scp->file_size, node->pathname);
        scp_source_push(
            scp, SCP_READFILE, node->pathname, scp->reply.handle, NULL, NULL);
    }
    sfree(node);
    scp_requeue(scp);
}